

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Client.cpp
# Opt level: O0

ssize_t __thiscall xmrig::Client::send(Client *this,int __fd,void *__buf,size_t __n,int __flags)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  long *in_stack_ffffffffffffff58;
  map<long,_xmrig::BaseClient::SendResult,_std::less<long>,_std::allocator<std::pair<const_long,_xmrig::BaseClient::SendResult>_>_>
  *this_00;
  
  this_00 = &(this->super_BaseClient).m_callbacks;
  (*(this->super_BaseClient).super_IClient._vptr_IClient[0xf])();
  std::pair<const_long,_xmrig::BaseClient::SendResult>::
  pair<long,_std::function<void_(const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_&,_bool,_unsigned_long)>,_true>
            ((pair<const_long,_xmrig::BaseClient::SendResult> *)this,in_stack_ffffffffffffff58,
             (function<void_(const_rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>_&,_bool,_unsigned_long)>
              *)0x1bef76);
  std::
  map<long,_xmrig::BaseClient::SendResult,_std::less<long>,_std::allocator<std::pair<const_long,_xmrig::BaseClient::SendResult>_>_>
  ::insert(this_00,(value_type *)__buf);
  std::pair<const_long,_xmrig::BaseClient::SendResult>::~pair
            ((pair<const_long,_xmrig::BaseClient::SendResult> *)0x1befac);
  iVar1 = (*(this->super_BaseClient).super_IClient._vptr_IClient[0xe])
                    (this,CONCAT44(in_register_00000034,__fd));
  return CONCAT44(extraout_var,iVar1);
}

Assistant:

int64_t xmrig::Client::send(const rapidjson::Value &obj, Callback callback)
{
    assert(obj["id"] == sequence());

    m_callbacks.insert({ sequence(), std::move(callback) });

    return send(obj);
}